

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestDeprecatedLite::SharedDtor(MessageLite *self)

{
  TestDeprecatedLite *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestDeprecatedLite *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestDeprecatedLite *)self;
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&local_18[1]._internal_metadata_);
    this = (TestDeprecatedLite *)local_18[2]._vptr_MessageLite;
    if (this != (TestDeprecatedLite *)0x0) {
      ~TestDeprecatedLite(this);
      operator_delete(this,0x30);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
             ,0x1a2e,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestDeprecatedLite::SharedDtor(MessageLite& self) {
  TestDeprecatedLite& this_ = static_cast<TestDeprecatedLite&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.deprecated_field3_.Destroy();
  delete this_._impl_.deprecated_field4_;
  this_._impl_.~Impl_();
}